

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshHeuristic(word *t,int nVars,int *pW)

{
  int iVar1;
  int nChows;
  uint uVar2;
  DdManager *dd;
  Vec_Str_t *vCube;
  char *pcVar3;
  DdNode *n;
  DdNode *n_00;
  char *pIsopFneg;
  ulong uVar4;
  size_t __size;
  bool bVar5;
  int Chow [16];
  
  iVar1 = 1;
  if (1 < nVars) {
    iVar1 = Abc_TtIsUnate(t,nVars);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      Abc_TtMakePosUnate(t,nVars);
      Extra_ThreshComputeChow(t,nVars,Chow);
      Extra_ThreshSortByChowInverted(t,nVars,Chow);
      nChows = Extra_ThreshInitializeChow(nVars,Chow);
      iVar1 = 0;
      dd = (DdManager *)Abc_FrameReadManDd();
      vCube = (Vec_Str_t *)malloc(0x10);
      __size = 0x10;
      if (0x10 < (uint)nVars) {
        __size = (size_t)(uint)nVars;
      }
      vCube->nSize = 0;
      vCube->nCap = (int)__size;
      pcVar3 = (char *)malloc(__size);
      vCube->pArray = pcVar3;
      do {
        Cudd_bddIthVar(dd,iVar1);
        iVar1 = iVar1 + 1;
      } while (nVars != iVar1);
      n = Kit_TruthToBdd(dd,(uint *)t,nVars,0);
      Cudd_Ref(n);
      pcVar3 = Abc_ConvertBddToSop((Mem_Flex_t *)0x0,dd,n,n,nVars,1,vCube,1);
      uVar2 = 1 << ((char)nVars - 5U & 0x1f);
      if (nVars < 6) {
        uVar2 = 1;
      }
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          t[uVar4] = ~t[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      n_00 = Kit_TruthToBdd(dd,(uint *)t,nVars,0);
      Cudd_Ref(n_00);
      pIsopFneg = Abc_ConvertBddToSop((Mem_Flex_t *)0x0,dd,n_00,n_00,nVars,1,vCube,1);
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,n_00);
      iVar1 = Extra_ThreshAssignWeights((word *)dd,pcVar3,pIsopFneg,nVars,pW,Chow,nChows,1);
      if ((5 < nVars) && (iVar1 == 0)) {
        uVar2 = 2;
        do {
          iVar1 = Extra_ThreshAssignWeights((word *)dd,pcVar3,pIsopFneg,nVars,pW,Chow,nChows,uVar2);
          if (iVar1 != 0) break;
          bVar5 = uVar2 < 3;
          uVar2 = uVar2 + 1;
        } while (bVar5);
      }
      free(pcVar3);
      free(pIsopFneg);
      if (vCube->pArray != (char *)0x0) {
        free(vCube->pArray);
      }
      free(vCube);
    }
  }
  return iVar1;
}

Assistant:

int Extra_ThreshHeuristic(word * t, int nVars, int * pW) {

    extern char * Abc_ConvertBddToSop( Mem_Flex_t * pMan, DdManager * dd, DdNode * bFuncOn, DdNode * bFuncOnDc, int nFanins, int fAllPrimes, Vec_Str_t * vCube, int fMode );
    int Chow0, Chow[16], nChows, i, T = 0;
    DdManager * dd;
    Vec_Str_t * vCube;
    DdNode * ddNode, * ddNodeFneg;
    char * pIsop, * pIsopFneg;
    if (nVars <= 1)
        return 1;
    if (!Abc_TtIsUnate(t, nVars))
        return 0;
    Abc_TtMakePosUnate(t, nVars);
    Chow0 = Extra_ThreshComputeChow(t, nVars, Chow);
    Extra_ThreshSortByChowInverted(t, nVars, Chow);
    nChows = Extra_ThreshInitializeChow(nVars, Chow);

    dd = (DdManager *) Abc_FrameReadManDd();
    vCube = Vec_StrAlloc(nVars);
    for (i = 0; i < nVars; i++)
        Cudd_bddIthVar(dd, i);
    ddNode = Kit_TruthToBdd(dd, (unsigned *) t, nVars, 0);
    Cudd_Ref(ddNode);
    pIsop = Abc_ConvertBddToSop( NULL, dd, ddNode, ddNode, nVars, 1,
            vCube, 1);

    Abc_TtNot(t, Abc_TruthWordNum(nVars));
    ddNodeFneg = Kit_TruthToBdd(dd, (unsigned *) t, nVars, 0);
    Cudd_Ref(ddNodeFneg);

    pIsopFneg = Abc_ConvertBddToSop( NULL, dd, ddNodeFneg, ddNodeFneg,
            nVars, 1, vCube, 1);

    Cudd_RecursiveDeref(dd, ddNode);
    Cudd_RecursiveDeref(dd, ddNodeFneg);

    T = Extra_ThreshAssignWeights(t, pIsop, pIsopFneg, nVars, pW, Chow, nChows,
            1);

    for (i = 2; (i < 4) && (T == 0) && (nVars >= 6); i++)
        T = Extra_ThreshAssignWeights(t, pIsop, pIsopFneg, nVars, pW, Chow,
                nChows, i);

    free(pIsop);
    free(pIsopFneg);
    Vec_StrFree(vCube);

    return T;
}